

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.hpp
# Opt level: O1

uint reference_leading_zeros(uint64_t x)

{
  uint uVar1;
  
  uVar1 = 0;
  if (-1 < (long)x) {
    do {
      uVar1 = uVar1 + 1;
      x = x * 2;
    } while (-1 < (long)x);
  }
  return uVar1;
}

Assistant:

unsigned int reference_leading_zeros(uint64_t x) {
    unsigned int n = 0;
    while (!(x & (static_cast<uint64_t>(0x1) << (sizeof(x)*8-1))))
    {
        ++n;
        x <<= 1;
    }
    return n;
}